

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 (*pauVar60) [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar67;
  uint uVar68;
  undefined1 (*pauVar69) [16];
  long lVar70;
  int iVar71;
  AABBNodeMB4D *node1;
  ulong uVar72;
  long lVar73;
  long lVar74;
  RTCRayQueryContext *pRVar75;
  ulong uVar76;
  undefined1 (*pauVar77) [16];
  undefined1 (*pauVar78) [16];
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  ulong uVar86;
  RTCIntersectArguments *pRVar87;
  ulong uVar88;
  long lVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  undefined1 auVar96 [16];
  float fVar100;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar99 [64];
  float fVar104;
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar108 [32];
  undefined1 auVar107 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar115;
  undefined1 auVar111 [32];
  float fVar113;
  float fVar114;
  float fVar116;
  float fVar117;
  undefined1 auVar112 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar138;
  float fVar139;
  undefined1 auVar126 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [32];
  float fVar140;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar129 [16];
  undefined1 auVar136 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar157 [16];
  float fVar153;
  float fVar154;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar160 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar184 [64];
  float fVar203;
  float fVar204;
  undefined1 auVar205 [32];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar206 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar216;
  undefined1 auVar217 [32];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar218 [64];
  float fVar225;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar228 [64];
  float fVar235;
  undefined1 auVar236 [32];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar237 [64];
  float fVar244;
  undefined1 auVar245 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar246 [64];
  float fVar253;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar254 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2a54;
  RayQueryContext *local_2a50;
  Scene *local_2a48;
  undefined8 local_2a40;
  float fStack_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  float fStack_2a28;
  float fStack_2a24;
  undefined1 local_2a20 [8];
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  undefined1 local_2a00 [8];
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  float fStack_29e4;
  RTCFilterFunctionNArguments local_29d0;
  undefined8 local_29a0;
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined1 local_2970 [8];
  float fStack_2968;
  float fStack_2964;
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  ulong local_2950;
  ulong local_2948;
  long local_2940;
  ulong local_2938;
  ulong local_2930;
  long local_2928;
  ulong local_2920;
  long local_2918;
  float local_2910;
  float local_290c;
  float local_2908;
  undefined4 local_2904;
  undefined4 local_2900;
  undefined4 local_28fc;
  uint local_28f8;
  uint local_28f4;
  uint local_28f0;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  undefined1 auStack_2850 [16];
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  undefined4 uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  undefined4 uStack_27c4;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  undefined1 local_2730 [8];
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  undefined1 local_2710 [8];
  float fStack_2708;
  float fStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar152 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar69 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    auVar106 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar112 = ZEXT464((uint)fVar3);
    auVar118 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar3));
    auVar127._8_4_ = 0x7fffffff;
    auVar127._0_8_ = 0x7fffffff7fffffff;
    auVar127._12_4_ = 0x7fffffff;
    auVar127 = vandps_avx((undefined1  [16])aVar5,auVar127);
    auVar129._8_4_ = 0x219392ef;
    auVar129._0_8_ = 0x219392ef219392ef;
    auVar129._12_4_ = 0x219392ef;
    auVar127 = vcmpps_avx(auVar127,auVar129,1);
    auVar155._8_4_ = 0x3f800000;
    auVar155._0_8_ = 0x3f8000003f800000;
    auVar155._12_4_ = 0x3f800000;
    auVar129 = vdivps_avx(auVar155,(undefined1  [16])aVar5);
    auVar156._8_4_ = 0x5d5e0b6b;
    auVar156._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar156._12_4_ = 0x5d5e0b6b;
    auVar127 = vblendvps_avx(auVar129,auVar156,auVar127);
    auVar144._0_4_ = auVar127._0_4_ * 0.99999964;
    auVar144._4_4_ = auVar127._4_4_ * 0.99999964;
    auVar144._8_4_ = auVar127._8_4_ * 0.99999964;
    auVar144._12_4_ = auVar127._12_4_ * 0.99999964;
    auVar126._0_4_ = auVar127._0_4_ * 1.0000004;
    auVar126._4_4_ = auVar127._4_4_ * 1.0000004;
    auVar126._8_4_ = auVar127._8_4_ * 1.0000004;
    auVar126._12_4_ = auVar127._12_4_ * 1.0000004;
    uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2420._4_4_ = uVar4;
    local_2420._0_4_ = uVar4;
    local_2420._8_4_ = uVar4;
    local_2420._12_4_ = uVar4;
    local_2420._16_4_ = uVar4;
    local_2420._20_4_ = uVar4;
    local_2420._24_4_ = uVar4;
    local_2420._28_4_ = uVar4;
    auVar184 = ZEXT3264(local_2420);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2440._4_4_ = uVar4;
    local_2440._0_4_ = uVar4;
    local_2440._8_4_ = uVar4;
    local_2440._12_4_ = uVar4;
    local_2440._16_4_ = uVar4;
    local_2440._20_4_ = uVar4;
    local_2440._24_4_ = uVar4;
    local_2440._28_4_ = uVar4;
    auVar206 = ZEXT3264(local_2440);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2460._4_4_ = uVar4;
    local_2460._0_4_ = uVar4;
    local_2460._8_4_ = uVar4;
    local_2460._12_4_ = uVar4;
    local_2460._16_4_ = uVar4;
    local_2460._20_4_ = uVar4;
    local_2460._24_4_ = uVar4;
    local_2460._28_4_ = uVar4;
    auVar215 = ZEXT3264(local_2460);
    auVar127 = vshufps_avx(auVar144,auVar144,0);
    local_2480._16_16_ = auVar127;
    local_2480._0_16_ = auVar127;
    auVar218 = ZEXT3264(local_2480);
    auVar127 = vmovshdup_avx(auVar144);
    auVar160 = ZEXT1664(auVar127);
    auVar129 = vshufps_avx(auVar144,auVar144,0x55);
    local_24a0._16_16_ = auVar129;
    local_24a0._0_16_ = auVar129;
    auVar228 = ZEXT3264(local_24a0);
    auVar129 = vshufpd_avx(auVar144,auVar144,1);
    auVar155 = vshufps_avx(auVar144,auVar144,0xaa);
    local_24c0._16_16_ = auVar155;
    local_24c0._0_16_ = auVar155;
    auVar237 = ZEXT3264(local_24c0);
    auVar155 = vshufps_avx(auVar126,auVar126,0);
    local_24e0._16_16_ = auVar155;
    local_24e0._0_16_ = auVar155;
    auVar246 = ZEXT3264(local_24e0);
    auVar155 = vshufps_avx(auVar126,auVar126,0x55);
    local_2500._16_16_ = auVar155;
    local_2500._0_16_ = auVar155;
    auVar254 = ZEXT3264(local_2500);
    auVar155 = vshufps_avx(auVar126,auVar126,0xaa);
    local_28a0._16_16_ = auVar155;
    local_28a0._0_16_ = auVar155;
    uVar79 = (ulong)(auVar144._0_4_ < 0.0) << 5;
    uVar93 = (ulong)(auVar127._0_4_ < 0.0) << 5 | 0x40;
    uVar80 = (ulong)(auVar129._0_4_ < 0.0) << 5 | 0x80;
    uVar88 = uVar79 ^ 0x20;
    uVar95 = uVar93 ^ 0x20;
    auVar127 = vshufps_avx(auVar106,auVar106,0);
    local_2520._16_16_ = auVar127;
    local_2520._0_16_ = auVar127;
    auVar179 = ZEXT3264(local_2520);
    auVar127 = vshufps_avx(auVar118,auVar118,0);
    local_23e0._16_16_ = mm_lookupmask_ps._240_16_;
    local_23e0._0_16_ = mm_lookupmask_ps._0_16_;
    auVar137 = ZEXT3264(local_23e0);
    auVar99 = ZEXT3264(CONCAT1616(auVar127,auVar127));
    auVar147._8_4_ = 0x3f800000;
    auVar147._0_8_ = 0x3f8000003f800000;
    auVar147._12_4_ = 0x3f800000;
    auVar147._16_4_ = 0x3f800000;
    auVar147._20_4_ = 0x3f800000;
    auVar147._24_4_ = 0x3f800000;
    auVar147._28_4_ = 0x3f800000;
    auVar152 = ZEXT3264(auVar147);
    auVar120._8_4_ = 0xbf800000;
    auVar120._0_8_ = 0xbf800000bf800000;
    auVar120._12_4_ = 0xbf800000;
    auVar120._16_4_ = 0xbf800000;
    auVar120._20_4_ = 0xbf800000;
    auVar120._24_4_ = 0xbf800000;
    auVar120._28_4_ = 0xbf800000;
    _local_2400 = vblendvps_avx(auVar147,auVar120,local_23e0);
    local_2a50 = context;
    local_2948 = uVar79;
    local_2950 = uVar93;
LAB_014db2b7:
    do {
      pauVar60 = pauVar69 + -1;
      pauVar69 = pauVar69 + -1;
      if (*(float *)(*pauVar60 + 8) <= auVar112._0_4_) {
        pauVar60 = pauVar69;
        uVar94 = *(ulong *)*pauVar69;
        while (pauVar69 = pauVar60, (uVar94 & 8) == 0) {
          uVar72 = uVar94 & 0xfffffffffffffff0;
          fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar121._4_4_ = fVar3;
          auVar121._0_4_ = fVar3;
          auVar121._8_4_ = fVar3;
          auVar121._12_4_ = fVar3;
          auVar121._16_4_ = fVar3;
          auVar121._20_4_ = fVar3;
          auVar121._24_4_ = fVar3;
          auVar121._28_4_ = fVar3;
          pfVar2 = (float *)(uVar72 + 0x100 + uVar79);
          pfVar1 = (float *)(uVar72 + 0x40 + uVar79);
          auVar108._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar108._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar108._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar108._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar108._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar108._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar108._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar108._28_4_ = auVar112._28_4_ + pfVar1[7];
          auVar120 = vsubps_avx(auVar108,auVar184._0_32_);
          auVar13._4_4_ = auVar218._4_4_ * auVar120._4_4_;
          auVar13._0_4_ = auVar218._0_4_ * auVar120._0_4_;
          auVar13._8_4_ = auVar218._8_4_ * auVar120._8_4_;
          auVar13._12_4_ = auVar218._12_4_ * auVar120._12_4_;
          auVar13._16_4_ = auVar218._16_4_ * auVar120._16_4_;
          auVar13._20_4_ = auVar218._20_4_ * auVar120._20_4_;
          auVar13._24_4_ = auVar218._24_4_ * auVar120._24_4_;
          auVar13._28_4_ = auVar120._28_4_;
          auVar120 = vmaxps_avx(auVar179._0_32_,auVar13);
          pfVar2 = (float *)(uVar72 + 0x100 + uVar93);
          pfVar1 = (float *)(uVar72 + 0x40 + uVar93);
          auVar130._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar130._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar130._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar130._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar130._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar130._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar130._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar130._28_4_ = auVar137._28_4_ + pfVar1[7];
          auVar147 = vsubps_avx(auVar130,auVar206._0_32_);
          auVar14._4_4_ = auVar228._4_4_ * auVar147._4_4_;
          auVar14._0_4_ = auVar228._0_4_ * auVar147._0_4_;
          auVar14._8_4_ = auVar228._8_4_ * auVar147._8_4_;
          auVar14._12_4_ = auVar228._12_4_ * auVar147._12_4_;
          auVar14._16_4_ = auVar228._16_4_ * auVar147._16_4_;
          auVar14._20_4_ = auVar228._20_4_ * auVar147._20_4_;
          auVar14._24_4_ = auVar228._24_4_ * auVar147._24_4_;
          auVar14._28_4_ = auVar147._28_4_;
          pfVar2 = (float *)(uVar72 + 0x100 + uVar80);
          pfVar1 = (float *)(uVar72 + 0x40 + uVar80);
          auVar148._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar148._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar148._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar148._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar148._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar148._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar148._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar148._28_4_ = auVar152._28_4_ + pfVar1[7];
          auVar13 = vsubps_avx(auVar148,auVar215._0_32_);
          auVar15._4_4_ = auVar237._4_4_ * auVar13._4_4_;
          auVar15._0_4_ = auVar237._0_4_ * auVar13._0_4_;
          auVar15._8_4_ = auVar237._8_4_ * auVar13._8_4_;
          auVar15._12_4_ = auVar237._12_4_ * auVar13._12_4_;
          auVar15._16_4_ = auVar237._16_4_ * auVar13._16_4_;
          auVar15._20_4_ = auVar237._20_4_ * auVar13._20_4_;
          auVar15._24_4_ = auVar237._24_4_ * auVar13._24_4_;
          auVar15._28_4_ = auVar13._28_4_;
          auVar147 = vmaxps_avx(auVar14,auVar15);
          local_26e0 = vmaxps_avx(auVar120,auVar147);
          pfVar2 = (float *)(uVar72 + 0x100 + uVar88);
          pfVar1 = (float *)(uVar72 + 0x40 + uVar88);
          auVar131._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar131._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar131._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar131._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar131._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar131._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar131._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar131._28_4_ = auVar147._28_4_ + pfVar1[7];
          auVar120 = vsubps_avx(auVar131,auVar184._0_32_);
          auVar16._4_4_ = auVar246._4_4_ * auVar120._4_4_;
          auVar16._0_4_ = auVar246._0_4_ * auVar120._0_4_;
          auVar16._8_4_ = auVar246._8_4_ * auVar120._8_4_;
          auVar16._12_4_ = auVar246._12_4_ * auVar120._12_4_;
          auVar16._16_4_ = auVar246._16_4_ * auVar120._16_4_;
          auVar16._20_4_ = auVar246._20_4_ * auVar120._20_4_;
          auVar16._24_4_ = auVar246._24_4_ * auVar120._24_4_;
          auVar16._28_4_ = auVar120._28_4_;
          pfVar2 = (float *)(uVar72 + 0x100 + uVar95);
          pfVar1 = (float *)(uVar72 + 0x40 + uVar95);
          auVar149._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar149._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar149._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar149._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar149._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar149._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar149._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar149._28_4_ = auVar13._28_4_ + pfVar1[7];
          auVar120 = vsubps_avx(auVar149,auVar206._0_32_);
          auVar17._4_4_ = auVar254._4_4_ * auVar120._4_4_;
          auVar17._0_4_ = auVar254._0_4_ * auVar120._0_4_;
          auVar17._8_4_ = auVar254._8_4_ * auVar120._8_4_;
          auVar17._12_4_ = auVar254._12_4_ * auVar120._12_4_;
          auVar17._16_4_ = auVar254._16_4_ * auVar120._16_4_;
          auVar17._20_4_ = auVar254._20_4_ * auVar120._20_4_;
          auVar17._24_4_ = auVar254._24_4_ * auVar120._24_4_;
          auVar17._28_4_ = auVar120._28_4_;
          pfVar2 = (float *)(uVar72 + 0x100 + (uVar80 ^ 0x20));
          pfVar1 = (float *)(uVar72 + 0x40 + (uVar80 ^ 0x20));
          auVar158._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar158._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar158._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar158._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar158._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar158._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar158._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar158._28_4_ = auVar160._28_4_ + pfVar1[7];
          auVar120 = vsubps_avx(auVar158,auVar215._0_32_);
          auVar18._4_4_ = local_28a0._4_4_ * auVar120._4_4_;
          auVar18._0_4_ = local_28a0._0_4_ * auVar120._0_4_;
          auVar18._8_4_ = local_28a0._8_4_ * auVar120._8_4_;
          auVar18._12_4_ = local_28a0._12_4_ * auVar120._12_4_;
          auVar18._16_4_ = local_28a0._16_4_ * auVar120._16_4_;
          auVar18._20_4_ = local_28a0._20_4_ * auVar120._20_4_;
          auVar18._24_4_ = local_28a0._24_4_ * auVar120._24_4_;
          auVar18._28_4_ = auVar120._28_4_;
          auVar160 = ZEXT3264(auVar18);
          auVar147 = vminps_avx(auVar17,auVar18);
          auVar120 = vminps_avx(auVar99._0_32_,auVar16);
          auVar120 = vminps_avx(auVar120,auVar147);
          auVar120 = vcmpps_avx(local_26e0,auVar120,2);
          if (((uint)uVar94 & 7) == 6) {
            auVar147 = vcmpps_avx(*(undefined1 (*) [32])(uVar72 + 0x1c0),auVar121,2);
            auVar13 = vcmpps_avx(auVar121,*(undefined1 (*) [32])(uVar72 + 0x1e0),1);
            auVar13 = vandps_avx(auVar147,auVar13);
            auVar120 = vandps_avx(auVar13,auVar120);
            auVar127 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          }
          else {
            auVar127 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          }
          auVar152 = ZEXT3264(auVar147);
          auVar127 = vpsllw_avx(auVar127,0xf);
          auVar137 = ZEXT1664(auVar127);
          if ((((((((auVar127 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar127 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar127 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar127 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar127 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar127 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar127 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar127[0xf]) {
            auVar127 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                              ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar112 = ZEXT1664(auVar127);
            if (pauVar69 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014db2b7;
          }
          auVar127 = vpacksswb_avx(auVar127,auVar127);
          auVar112 = ZEXT1664(auVar127);
          bVar24 = SUB161(auVar127 >> 7,0) & 1 | (SUB161(auVar127 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar127 >> 0x17,0) & 1) << 2 | (SUB161(auVar127 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar127 >> 0x27,0) & 1) << 4 | (SUB161(auVar127 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar127 >> 0x37,0) & 1) << 6 | SUB161(auVar127 >> 0x3f,0) << 7;
          lVar73 = 0;
          if (bVar24 != 0) {
            for (; (bVar24 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
            }
          }
          uVar94 = *(ulong *)(uVar72 + lVar73 * 8);
          uVar85 = bVar24 - 1 & (uint)bVar24;
          pauVar60 = pauVar69;
          if (uVar85 != 0) {
            uVar68 = *(uint *)(local_26e0 + lVar73 * 4);
            lVar73 = 0;
            if (uVar85 != 0) {
              for (; (uVar85 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
              }
            }
            uVar76 = *(ulong *)(uVar72 + lVar73 * 8);
            uVar67 = *(uint *)(local_26e0 + lVar73 * 4);
            uVar85 = uVar85 - 1 & uVar85;
            if (uVar85 == 0) {
              pauVar60 = pauVar69 + 1;
              if (uVar68 < uVar67) {
                *(ulong *)*pauVar69 = uVar76;
                *(uint *)(*pauVar69 + 8) = uVar67;
              }
              else {
                *(ulong *)*pauVar69 = uVar94;
                *(uint *)(*pauVar69 + 8) = uVar68;
                uVar94 = uVar76;
              }
            }
            else {
              auVar106._8_8_ = 0;
              auVar106._0_8_ = uVar94;
              auVar127 = vpunpcklqdq_avx(auVar106,ZEXT416(uVar68));
              auVar118._8_8_ = 0;
              auVar118._0_8_ = uVar76;
              auVar129 = vpunpcklqdq_avx(auVar118,ZEXT416(uVar67));
              lVar73 = 0;
              if (uVar85 != 0) {
                for (; (uVar85 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                }
              }
              auVar128._8_8_ = 0;
              auVar128._0_8_ = *(ulong *)(uVar72 + lVar73 * 8);
              auVar106 = vpunpcklqdq_avx(auVar128,ZEXT416(*(uint *)(local_26e0 + lVar73 * 4)));
              auVar137 = ZEXT1664(auVar106);
              uVar85 = uVar85 - 1 & uVar85;
              if (uVar85 == 0) {
                auVar118 = vpcmpgtd_avx(auVar129,auVar127);
                auVar155 = vpshufd_avx(auVar118,0xaa);
                auVar118 = vblendvps_avx(auVar129,auVar127,auVar155);
                auVar127 = vblendvps_avx(auVar127,auVar129,auVar155);
                auVar129 = vpcmpgtd_avx(auVar106,auVar118);
                auVar155 = vpshufd_avx(auVar129,0xaa);
                auVar129 = vblendvps_avx(auVar106,auVar118,auVar155);
                auVar152 = ZEXT1664(auVar129);
                auVar106 = vblendvps_avx(auVar118,auVar106,auVar155);
                auVar118 = vpcmpgtd_avx(auVar106,auVar127);
                auVar155 = vpshufd_avx(auVar118,0xaa);
                auVar137 = ZEXT1664(auVar155);
                auVar118 = vblendvps_avx(auVar106,auVar127,auVar155);
                auVar160 = ZEXT1664(auVar118);
                auVar127 = vblendvps_avx(auVar127,auVar106,auVar155);
                auVar112 = ZEXT1664(auVar127);
                *pauVar69 = auVar127;
                pauVar69[1] = auVar118;
                uVar94 = auVar129._0_8_;
                pauVar60 = pauVar69 + 2;
              }
              else {
                lVar73 = 0;
                if (uVar85 != 0) {
                  for (; (uVar85 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                  }
                }
                auVar160 = ZEXT464(*(uint *)(local_26e0 + lVar73 * 4));
                auVar145._8_8_ = 0;
                auVar145._0_8_ = *(ulong *)(uVar72 + lVar73 * 8);
                auVar118 = vpunpcklqdq_avx(auVar145,ZEXT416(*(uint *)(local_26e0 + lVar73 * 4)));
                auVar152 = ZEXT1664(auVar118);
                uVar85 = uVar85 - 1 & uVar85;
                uVar76 = (ulong)uVar85;
                if (uVar85 == 0) {
                  auVar155 = vpcmpgtd_avx(auVar129,auVar127);
                  auVar126 = vpshufd_avx(auVar155,0xaa);
                  auVar155 = vblendvps_avx(auVar129,auVar127,auVar126);
                  auVar127 = vblendvps_avx(auVar127,auVar129,auVar126);
                  auVar129 = vpcmpgtd_avx(auVar118,auVar106);
                  auVar126 = vpshufd_avx(auVar129,0xaa);
                  auVar129 = vblendvps_avx(auVar118,auVar106,auVar126);
                  auVar106 = vblendvps_avx(auVar106,auVar118,auVar126);
                  auVar118 = vpcmpgtd_avx(auVar106,auVar127);
                  auVar126 = vpshufd_avx(auVar118,0xaa);
                  auVar118 = vblendvps_avx(auVar106,auVar127,auVar126);
                  auVar152 = ZEXT1664(auVar118);
                  auVar127 = vblendvps_avx(auVar127,auVar106,auVar126);
                  auVar112 = ZEXT1664(auVar127);
                  auVar106 = vpcmpgtd_avx(auVar129,auVar155);
                  auVar126 = vpshufd_avx(auVar106,0xaa);
                  auVar106 = vblendvps_avx(auVar129,auVar155,auVar126);
                  auVar137 = ZEXT1664(auVar106);
                  auVar129 = vblendvps_avx(auVar155,auVar129,auVar126);
                  auVar155 = vpcmpgtd_avx(auVar118,auVar129);
                  auVar126 = vpshufd_avx(auVar155,0xaa);
                  auVar160 = ZEXT1664(auVar126);
                  auVar155 = vblendvps_avx(auVar118,auVar129,auVar126);
                  auVar129 = vblendvps_avx(auVar129,auVar118,auVar126);
                  *pauVar69 = auVar127;
                  pauVar69[1] = auVar129;
                  pauVar69[2] = auVar155;
                  uVar94 = auVar106._0_8_;
                  pauVar60 = pauVar69 + 3;
                }
                else {
                  *pauVar69 = auVar127;
                  pauVar69[1] = auVar129;
                  pauVar69[2] = auVar106;
                  pauVar69[3] = auVar118;
                  lVar73 = 0x30;
                  do {
                    lVar70 = lVar73;
                    lVar73 = 0;
                    if (uVar76 != 0) {
                      for (; (uVar76 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                      }
                    }
                    uVar94 = *(ulong *)(uVar72 + lVar73 * 8);
                    auVar107._8_8_ = 0;
                    auVar107._0_8_ = uVar94;
                    auVar127 = vpunpcklqdq_avx(auVar107,ZEXT416(*(uint *)(local_26e0 + lVar73 * 4)))
                    ;
                    auVar112 = ZEXT1664(auVar127);
                    *(undefined1 (*) [16])(pauVar69[1] + lVar70) = auVar127;
                    uVar76 = uVar76 & uVar76 - 1;
                    lVar73 = lVar70 + 0x10;
                  } while (uVar76 != 0);
                  pauVar60 = (undefined1 (*) [16])(pauVar69[1] + lVar70);
                  if (lVar70 + 0x10 != 0) {
                    lVar73 = 0x10;
                    pauVar77 = pauVar69;
                    do {
                      auVar127 = pauVar77[1];
                      auVar112 = ZEXT1664(auVar127);
                      pauVar77 = pauVar77 + 1;
                      uVar85 = vextractps_avx(auVar127,2);
                      lVar70 = lVar73;
                      do {
                        if (uVar85 <= *(uint *)(pauVar69[-1] + lVar70 + 8)) {
                          pauVar78 = (undefined1 (*) [16])(*pauVar69 + lVar70);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar69 + lVar70) =
                             *(undefined1 (*) [16])(pauVar69[-1] + lVar70);
                        lVar70 = lVar70 + -0x10;
                        pauVar78 = pauVar69;
                      } while (lVar70 != 0);
                      *pauVar78 = auVar127;
                      lVar73 = lVar73 + 0x10;
                    } while (pauVar60 != pauVar77);
                    uVar94 = *(ulong *)*pauVar60;
                  }
                }
              }
            }
          }
        }
        local_2940 = (ulong)((uint)uVar94 & 0xf) - 8;
        if (local_2940 != 0) {
          uVar94 = uVar94 & 0xfffffffffffffff0;
          local_2a48 = local_2a50->scene;
          local_2918 = 0;
          do {
            lVar70 = local_2918 * 0x60;
            pRVar6 = (local_2a48->geometries).items;
            pGVar7 = pRVar6[*(uint *)(uVar94 + 0x40 + lVar70)].ptr;
            fVar3 = (pGVar7->time_range).lower;
            fVar3 = pGVar7->fnumTimeSegments *
                    (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar3) /
                    ((pGVar7->time_range).upper - fVar3));
            auVar127 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
            auVar127 = vminss_avx(auVar127,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
            auVar119 = vmaxss_avx(ZEXT816(0) << 0x20,auVar127);
            iVar71 = (int)auVar119._0_4_;
            lVar89 = (long)iVar71 * 0x38;
            lVar73 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar89);
            uVar86 = (ulong)*(uint *)(uVar94 + 4 + lVar70);
            auVar127 = *(undefined1 (*) [16])(lVar73 + (ulong)*(uint *)(uVar94 + lVar70) * 4);
            uVar93 = (ulong)*(uint *)(uVar94 + 0x10 + lVar70);
            auVar129 = *(undefined1 (*) [16])(lVar73 + uVar93 * 4);
            uVar72 = (ulong)*(uint *)(uVar94 + 0x20 + lVar70);
            auVar106 = *(undefined1 (*) [16])(lVar73 + uVar72 * 4);
            uVar76 = (ulong)*(uint *)(uVar94 + 0x30 + lVar70);
            auVar118 = *(undefined1 (*) [16])(lVar73 + uVar76 * 4);
            local_2928 = *(long *)&pRVar6[*(uint *)(uVar94 + 0x44 + lVar70)].ptr[2].numPrimitives;
            lVar73 = *(long *)(local_2928 + lVar89);
            auVar155 = *(undefined1 (*) [16])(lVar73 + uVar86 * 4);
            uVar81 = (ulong)*(uint *)(uVar94 + 0x14 + lVar70);
            auVar126 = *(undefined1 (*) [16])(lVar73 + uVar81 * 4);
            uVar82 = (ulong)*(uint *)(uVar94 + 0x24 + lVar70);
            auVar144 = *(undefined1 (*) [16])(lVar73 + uVar82 * 4);
            uVar83 = (ulong)*(uint *)(uVar94 + 0x34 + lVar70);
            auVar156 = *(undefined1 (*) [16])(lVar73 + uVar83 * 4);
            lVar73 = *(long *)&pRVar6[*(uint *)(uVar94 + 0x48 + lVar70)].ptr[2].numPrimitives;
            lVar8 = *(long *)(lVar73 + lVar89);
            uVar84 = (ulong)*(uint *)(uVar94 + 8 + lVar70);
            auVar128 = *(undefined1 (*) [16])(lVar8 + uVar84 * 4);
            local_2920 = (ulong)*(uint *)(uVar94 + 0x18 + lVar70);
            auVar145 = *(undefined1 (*) [16])(lVar8 + local_2920 * 4);
            uVar91 = CONCAT44(0,*(uint *)(uVar94 + 0x28 + lVar70));
            local_2880._0_8_ = uVar91;
            auVar107 = *(undefined1 (*) [16])(lVar8 + uVar91 * 4);
            uVar92 = (ulong)*(uint *)(uVar94 + 0x38 + lVar70);
            auVar96 = *(undefined1 (*) [16])(lVar8 + uVar92 * 4);
            fVar3 = fVar3 - auVar119._0_4_;
            lVar8 = *(long *)&pRVar6[*(uint *)(uVar94 + 0x4c + lVar70)].ptr[2].numPrimitives;
            lVar89 = *(long *)(lVar8 + lVar89);
            uVar79 = (ulong)*(uint *)(uVar94 + 0xc + lVar70);
            auVar119 = *(undefined1 (*) [16])(lVar89 + uVar79 * 4);
            local_2938 = (ulong)*(uint *)(uVar94 + 0x1c + lVar70);
            auVar146 = *(undefined1 (*) [16])(lVar89 + local_2938 * 4);
            auVar157 = vunpcklps_avx(auVar127,auVar128);
            auVar128 = vunpckhps_avx(auVar127,auVar128);
            auVar245 = vunpcklps_avx(auVar155,auVar119);
            auVar155 = vunpckhps_avx(auVar155,auVar119);
            uVar90 = (ulong)*(uint *)(uVar94 + 0x2c + lVar70);
            auVar127 = *(undefined1 (*) [16])(lVar89 + uVar90 * 4);
            auVar119 = vunpcklps_avx(auVar128,auVar155);
            _local_2710 = vunpcklps_avx(auVar157,auVar245);
            auVar66 = _local_2710;
            auVar155 = vunpckhps_avx(auVar157,auVar245);
            auVar157 = vunpcklps_avx(auVar129,auVar145);
            auVar128 = vunpckhps_avx(auVar129,auVar145);
            auVar145 = vunpcklps_avx(auVar126,auVar146);
            auVar126 = vunpckhps_avx(auVar126,auVar146);
            local_2930 = (ulong)*(uint *)(uVar94 + 0x3c + lVar70);
            auVar129 = *(undefined1 (*) [16])(lVar89 + local_2930 * 4);
            auVar128 = vunpcklps_avx(auVar128,auVar126);
            auVar146 = vunpcklps_avx(auVar157,auVar145);
            _local_2860 = auVar146;
            auVar130 = _local_2860;
            auVar126 = vunpckhps_avx(auVar157,auVar145);
            auVar145 = vunpcklps_avx(auVar106,auVar107);
            auVar106 = vunpckhps_avx(auVar106,auVar107);
            auVar107 = vunpcklps_avx(auVar144,auVar127);
            auVar144 = vunpckhps_avx(auVar144,auVar127);
            lVar74 = (long)(iVar71 + 1) * 0x38;
            lVar89 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar74);
            auVar127 = *(undefined1 (*) [16])(lVar89 + (ulong)*(uint *)(uVar94 + lVar70) * 4);
            _local_2960 = vunpcklps_avx(auVar106,auVar144);
            auVar62 = _local_2960;
            _local_2740 = vunpcklps_avx(auVar145,auVar107);
            auVar63 = _local_2740;
            _local_2730 = vunpckhps_avx(auVar145,auVar107);
            auVar64 = _local_2730;
            auVar144 = vunpcklps_avx(auVar118,auVar96);
            auVar106 = vunpckhps_avx(auVar118,auVar96);
            auVar145 = vunpcklps_avx(auVar156,auVar129);
            auVar118 = vunpckhps_avx(auVar156,auVar129);
            lVar73 = *(long *)(lVar73 + lVar74);
            auVar129 = *(undefined1 (*) [16])(lVar73 + uVar84 * 4);
            _local_2970 = vunpcklps_avx(auVar106,auVar118);
            auVar61 = _local_2970;
            auVar107 = vunpcklps_avx(auVar144,auVar145);
            _local_2720 = vunpckhps_avx(auVar144,auVar145);
            auVar65 = _local_2720;
            lVar9 = *(long *)(local_2928 + lVar74);
            auVar118 = vunpcklps_avx(auVar127,auVar129);
            auVar106 = vunpckhps_avx(auVar127,auVar129);
            auVar127 = *(undefined1 (*) [16])(lVar9 + uVar86 * 4);
            lVar8 = *(long *)(lVar8 + lVar74);
            auVar129 = *(undefined1 (*) [16])(lVar8 + uVar79 * 4);
            auVar144 = vunpcklps_avx(auVar127,auVar129);
            auVar127 = vunpckhps_avx(auVar127,auVar129);
            auVar145 = vunpcklps_avx(auVar106,auVar127);
            auVar96 = vunpcklps_avx(auVar118,auVar144);
            auVar106 = vunpckhps_avx(auVar118,auVar144);
            auVar127 = *(undefined1 (*) [16])(lVar89 + uVar93 * 4);
            auVar129 = *(undefined1 (*) [16])(lVar73 + local_2920 * 4);
            auVar144 = vunpcklps_avx(auVar127,auVar129);
            auVar118 = vunpckhps_avx(auVar127,auVar129);
            auVar127 = *(undefined1 (*) [16])(lVar9 + uVar81 * 4);
            auVar129 = *(undefined1 (*) [16])(lVar8 + local_2938 * 4);
            auVar156 = vunpcklps_avx(auVar127,auVar129);
            auVar127 = vunpckhps_avx(auVar127,auVar129);
            auVar157 = vunpcklps_avx(auVar118,auVar127);
            auVar245 = vunpcklps_avx(auVar144,auVar156);
            auVar118 = vunpckhps_avx(auVar144,auVar156);
            auVar127 = *(undefined1 (*) [16])(lVar89 + uVar72 * 4);
            auVar129 = *(undefined1 (*) [16])(lVar73 + uVar91 * 4);
            auVar156 = vunpcklps_avx(auVar127,auVar129);
            auVar144 = vunpckhps_avx(auVar127,auVar129);
            auVar127 = *(undefined1 (*) [16])(lVar9 + uVar82 * 4);
            auVar129 = *(undefined1 (*) [16])(lVar8 + uVar90 * 4);
            auVar176 = vunpcklps_avx(auVar127,auVar129);
            auVar127 = vunpckhps_avx(auVar127,auVar129);
            auVar19 = vunpcklps_avx(auVar144,auVar127);
            auVar20 = vunpcklps_avx(auVar156,auVar176);
            auVar144 = vunpckhps_avx(auVar156,auVar176);
            auVar127 = *(undefined1 (*) [16])(lVar89 + uVar76 * 4);
            auVar129 = *(undefined1 (*) [16])(lVar73 + uVar92 * 4);
            auVar176 = vunpcklps_avx(auVar127,auVar129);
            auVar156 = vunpckhps_avx(auVar127,auVar129);
            auVar127 = *(undefined1 (*) [16])(lVar9 + uVar83 * 4);
            auVar129 = *(undefined1 (*) [16])(lVar8 + local_2930 * 4);
            auVar21 = vunpcklps_avx(auVar127,auVar129);
            auVar127 = vunpckhps_avx(auVar127,auVar129);
            auVar22 = vunpcklps_avx(auVar156,auVar127);
            auVar23 = vunpcklps_avx(auVar176,auVar21);
            auVar156 = vunpckhps_avx(auVar176,auVar21);
            auVar127 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
            auVar129 = vshufps_avx(ZEXT416((uint)(1.0 - fVar3)),ZEXT416((uint)(1.0 - fVar3)),0);
            fVar3 = auVar127._0_4_;
            fVar10 = auVar127._4_4_;
            fVar11 = auVar127._8_4_;
            fVar12 = auVar127._12_4_;
            fVar104 = auVar129._0_4_;
            fVar113 = auVar129._4_4_;
            fVar114 = auVar129._8_4_;
            fVar105 = auVar129._12_4_;
            auVar109._4_4_ = fVar113 * (float)local_2710._4_4_ + auVar96._4_4_ * fVar10;
            auVar109._0_4_ = fVar104 * (float)local_2710._0_4_ + auVar96._0_4_ * fVar3;
            auVar109._8_4_ = fVar114 * fStack_2708 + auVar96._8_4_ * fVar11;
            auVar109._12_4_ = fVar105 * fStack_2704 + auVar96._12_4_ * fVar12;
            local_2840._0_4_ = auVar155._0_4_;
            local_2840._4_4_ = auVar155._4_4_;
            fStack_2838 = auVar155._8_4_;
            fStack_2834 = auVar155._12_4_;
            auVar132._4_4_ = fVar113 * (float)local_2840._4_4_ + fVar10 * auVar106._4_4_;
            auVar132._0_4_ = fVar104 * (float)local_2840._0_4_ + fVar3 * auVar106._0_4_;
            auVar132._8_4_ = fVar114 * fStack_2838 + fVar11 * auVar106._8_4_;
            auVar132._12_4_ = fVar105 * fStack_2834 + fVar12 * auVar106._12_4_;
            local_27e0._0_4_ = auVar119._0_4_;
            local_27e0._4_4_ = auVar119._4_4_;
            fStack_27d8 = auVar119._8_4_;
            fStack_27d4 = auVar119._12_4_;
            auVar174._4_4_ = fVar113 * (float)local_27e0._4_4_ + auVar145._4_4_ * fVar10;
            auVar174._0_4_ = fVar104 * (float)local_27e0._0_4_ + auVar145._0_4_ * fVar3;
            auVar174._8_4_ = fVar114 * fStack_27d8 + auVar145._8_4_ * fVar11;
            auVar174._12_4_ = fVar105 * fStack_27d4 + auVar145._12_4_ * fVar12;
            local_2860._0_4_ = auVar146._0_4_;
            local_2860._4_4_ = auVar146._4_4_;
            fStack_2858 = auVar146._8_4_;
            fStack_2854 = auVar146._12_4_;
            auVar176._0_4_ = fVar104 * (float)local_2860._0_4_ + fVar3 * auVar245._0_4_;
            auVar176._4_4_ = fVar113 * (float)local_2860._4_4_ + fVar10 * auVar245._4_4_;
            auVar176._8_4_ = fVar114 * fStack_2858 + fVar11 * auVar245._8_4_;
            auVar176._12_4_ = fVar105 * fStack_2854 + fVar12 * auVar245._12_4_;
            local_2820._0_4_ = auVar126._0_4_;
            local_2820._4_4_ = auVar126._4_4_;
            fStack_2818 = auVar126._8_4_;
            fStack_2814 = auVar126._12_4_;
            auVar119._0_4_ = fVar104 * (float)local_2820._0_4_ + auVar118._0_4_ * fVar3;
            auVar119._4_4_ = fVar113 * (float)local_2820._4_4_ + auVar118._4_4_ * fVar10;
            auVar119._8_4_ = fVar114 * fStack_2818 + auVar118._8_4_ * fVar11;
            auVar119._12_4_ = fVar105 * fStack_2814 + auVar118._12_4_ * fVar12;
            local_27c0._0_4_ = auVar128._0_4_;
            local_27c0._4_4_ = auVar128._4_4_;
            fStack_27b8 = auVar128._8_4_;
            fStack_27b4 = auVar128._12_4_;
            auVar245._0_4_ = fVar104 * (float)local_27c0._0_4_ + auVar157._0_4_ * fVar3;
            auVar245._4_4_ = fVar113 * (float)local_27c0._4_4_ + auVar157._4_4_ * fVar10;
            auVar245._8_4_ = fVar114 * fStack_27b8 + auVar157._8_4_ * fVar11;
            auVar245._12_4_ = fVar105 * fStack_27b4 + auVar157._12_4_ * fVar12;
            auVar109._20_4_ = fVar113 * (float)local_2740._4_4_ + fVar10 * auVar20._4_4_;
            auVar109._16_4_ = fVar104 * (float)local_2740._0_4_ + fVar3 * auVar20._0_4_;
            auVar109._24_4_ = fVar114 * fStack_2738 + fVar11 * auVar20._8_4_;
            auVar109._28_4_ = fVar105 * fStack_2734 + fVar12 * auVar20._12_4_;
            auVar132._20_4_ = fVar113 * (float)local_2730._4_4_ + auVar144._4_4_ * fVar10;
            auVar132._16_4_ = fVar104 * (float)local_2730._0_4_ + auVar144._0_4_ * fVar3;
            auVar132._24_4_ = fVar114 * fStack_2728 + auVar144._8_4_ * fVar11;
            auVar132._28_4_ = fVar105 * fStack_2724 + auVar144._12_4_ * fVar12;
            auVar174._20_4_ = fVar113 * (float)local_2960._4_4_ + auVar19._4_4_ * fVar10;
            auVar174._16_4_ = fVar104 * (float)local_2960._0_4_ + auVar19._0_4_ * fVar3;
            auVar174._24_4_ = fVar114 * fStack_2958 + auVar19._8_4_ * fVar11;
            auVar174._28_4_ = fVar105 * fStack_2954 + auVar19._12_4_ * fVar12;
            lVar73 = uVar94 + 0x40 + lVar70;
            local_23c0 = *(undefined8 *)(lVar73 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar73 + 0x18);
            auVar146._0_4_ = auVar107._0_4_ * fVar104 + fVar3 * auVar23._0_4_;
            auVar146._4_4_ = auVar107._4_4_ * fVar113 + fVar10 * auVar23._4_4_;
            auVar146._8_4_ = auVar107._8_4_ * fVar114 + fVar11 * auVar23._8_4_;
            auVar146._12_4_ = auVar107._12_4_ * fVar105 + fVar12 * auVar23._12_4_;
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar70 = uVar94 + 0x50 + lVar70;
            local_2700 = *(undefined8 *)(lVar70 + 0x10);
            uStack_26f8 = *(undefined8 *)(lVar70 + 0x18);
            auVar157._0_4_ = fVar104 * (float)local_2720._0_4_ + fVar3 * auVar156._0_4_;
            auVar157._4_4_ = fVar113 * (float)local_2720._4_4_ + fVar10 * auVar156._4_4_;
            auVar157._8_4_ = fVar114 * fStack_2718 + fVar11 * auVar156._8_4_;
            auVar157._12_4_ = fVar105 * fStack_2714 + fVar12 * auVar156._12_4_;
            auVar96._0_4_ = fVar104 * (float)local_2970._0_4_ + fVar3 * auVar22._0_4_;
            auVar96._4_4_ = fVar113 * (float)local_2970._4_4_ + fVar10 * auVar22._4_4_;
            auVar96._8_4_ = fVar114 * fStack_2968 + fVar11 * auVar22._8_4_;
            auVar96._12_4_ = fVar105 * fStack_2964 + fVar12 * auVar22._12_4_;
            uStack_26f0 = local_2700;
            uStack_26e8 = uStack_26f8;
            auVar177._16_16_ = auVar176;
            auVar177._0_16_ = auVar176;
            auVar122._16_16_ = auVar119;
            auVar122._0_16_ = auVar119;
            auVar183._16_16_ = auVar245;
            auVar183._0_16_ = auVar245;
            auVar205._16_16_ = auVar146;
            auVar205._0_16_ = auVar146;
            auVar159._16_16_ = auVar157;
            auVar159._0_16_ = auVar157;
            auVar214._16_16_ = auVar96;
            auVar214._0_16_ = auVar96;
            uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar217._4_4_ = uVar4;
            auVar217._0_4_ = uVar4;
            auVar217._8_4_ = uVar4;
            auVar217._12_4_ = uVar4;
            auVar217._16_4_ = uVar4;
            auVar217._20_4_ = uVar4;
            auVar217._24_4_ = uVar4;
            auVar217._28_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar226._4_4_ = uVar4;
            auVar226._0_4_ = uVar4;
            auVar226._8_4_ = uVar4;
            auVar226._12_4_ = uVar4;
            auVar226._16_4_ = uVar4;
            auVar226._20_4_ = uVar4;
            auVar226._24_4_ = uVar4;
            auVar226._28_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar236._4_4_ = uVar4;
            auVar236._0_4_ = uVar4;
            auVar236._8_4_ = uVar4;
            auVar236._12_4_ = uVar4;
            auVar236._16_4_ = uVar4;
            auVar236._20_4_ = uVar4;
            auVar236._24_4_ = uVar4;
            auVar236._28_4_ = uVar4;
            local_28e0 = vsubps_avx(auVar109,auVar217);
            local_2760 = vsubps_avx(auVar132,auVar226);
            local_2780 = vsubps_avx(auVar174,auVar236);
            auVar120 = vsubps_avx(auVar177,auVar217);
            auVar147 = vsubps_avx(auVar122,auVar226);
            auVar13 = vsubps_avx(auVar183,auVar236);
            auVar14 = vsubps_avx(auVar205,auVar217);
            auVar15 = vsubps_avx(auVar159,auVar226);
            auVar16 = vsubps_avx(auVar214,auVar236);
            local_27a0 = vsubps_avx(auVar14,local_28e0);
            _local_27c0 = vsubps_avx(auVar15,local_2760);
            _local_27e0 = vsubps_avx(auVar16,local_2780);
            fVar3 = local_2760._0_4_;
            fVar153 = auVar15._0_4_ + fVar3;
            fVar10 = local_2760._4_4_;
            fVar161 = auVar15._4_4_ + fVar10;
            fVar11 = local_2760._8_4_;
            fVar163 = auVar15._8_4_ + fVar11;
            fVar12 = local_2760._12_4_;
            fVar165 = auVar15._12_4_ + fVar12;
            fVar104 = local_2760._16_4_;
            fVar167 = auVar15._16_4_ + fVar104;
            fVar113 = local_2760._20_4_;
            fVar169 = auVar15._20_4_ + fVar113;
            fVar114 = local_2760._24_4_;
            fVar171 = auVar15._24_4_ + fVar114;
            fVar105 = local_2760._28_4_;
            fVar253 = local_2780._0_4_;
            fVar180 = fVar253 + auVar16._0_4_;
            fVar255 = local_2780._4_4_;
            fVar185 = fVar255 + auVar16._4_4_;
            fVar256 = local_2780._8_4_;
            fVar188 = fVar256 + auVar16._8_4_;
            fVar257 = local_2780._12_4_;
            fVar191 = fVar257 + auVar16._12_4_;
            fVar258 = local_2780._16_4_;
            fVar194 = fVar258 + auVar16._16_4_;
            fVar259 = local_2780._20_4_;
            fVar197 = fVar259 + auVar16._20_4_;
            fVar260 = local_2780._24_4_;
            fVar200 = fVar260 + auVar16._24_4_;
            fVar125 = local_2780._28_4_;
            fVar115 = local_27e0._0_4_;
            fVar116 = local_27e0._4_4_;
            auVar25._4_4_ = fVar116 * fVar161;
            auVar25._0_4_ = fVar115 * fVar153;
            fVar117 = local_27e0._8_4_;
            auVar25._8_4_ = fVar117 * fVar163;
            fVar100 = local_27e0._12_4_;
            auVar25._12_4_ = fVar100 * fVar165;
            fVar101 = local_27e0._16_4_;
            auVar25._16_4_ = fVar101 * fVar167;
            fVar102 = local_27e0._20_4_;
            auVar25._20_4_ = fVar102 * fVar169;
            fVar103 = local_27e0._24_4_;
            auVar25._24_4_ = fVar103 * fVar171;
            auVar25._28_4_ = auVar146._12_4_;
            fVar225 = local_27c0._0_4_;
            fVar229 = local_27c0._4_4_;
            auVar26._4_4_ = fVar229 * fVar185;
            auVar26._0_4_ = fVar225 * fVar180;
            fVar230 = local_27c0._8_4_;
            auVar26._8_4_ = fVar230 * fVar188;
            fVar231 = local_27c0._12_4_;
            auVar26._12_4_ = fVar231 * fVar191;
            fVar232 = local_27c0._16_4_;
            auVar26._16_4_ = fVar232 * fVar194;
            fVar233 = local_27c0._20_4_;
            auVar26._20_4_ = fVar233 * fVar197;
            fVar234 = local_27c0._24_4_;
            auVar26._24_4_ = fVar234 * fVar200;
            auVar26._28_4_ = auVar96._12_4_;
            auVar17 = vsubps_avx(auVar26,auVar25);
            fVar244 = local_28e0._0_4_;
            fVar203 = fVar244 + auVar14._0_4_;
            fVar247 = local_28e0._4_4_;
            fVar207 = fVar247 + auVar14._4_4_;
            fVar248 = local_28e0._8_4_;
            fVar209 = fVar248 + auVar14._8_4_;
            fVar249 = local_28e0._12_4_;
            fVar210 = fVar249 + auVar14._12_4_;
            fVar250 = local_28e0._16_4_;
            fVar211 = fVar250 + auVar14._16_4_;
            fVar251 = local_28e0._20_4_;
            fVar212 = fVar251 + auVar14._20_4_;
            fVar252 = local_28e0._24_4_;
            fVar213 = fVar252 + auVar14._24_4_;
            fVar216 = local_27a0._0_4_;
            fVar219 = local_27a0._4_4_;
            auVar27._4_4_ = fVar219 * fVar185;
            auVar27._0_4_ = fVar216 * fVar180;
            fVar220 = local_27a0._8_4_;
            auVar27._8_4_ = fVar220 * fVar188;
            fVar221 = local_27a0._12_4_;
            auVar27._12_4_ = fVar221 * fVar191;
            fVar222 = local_27a0._16_4_;
            auVar27._16_4_ = fVar222 * fVar194;
            fVar223 = local_27a0._20_4_;
            auVar27._20_4_ = fVar223 * fVar197;
            fVar224 = local_27a0._24_4_;
            auVar27._24_4_ = fVar224 * fVar200;
            auVar27._28_4_ = fVar125 + auVar16._28_4_;
            auVar148 = _local_27e0;
            auVar28._4_4_ = fVar207 * fVar116;
            auVar28._0_4_ = fVar203 * fVar115;
            auVar28._8_4_ = fVar209 * fVar117;
            auVar28._12_4_ = fVar210 * fVar100;
            auVar28._16_4_ = fVar211 * fVar101;
            auVar28._20_4_ = fVar212 * fVar102;
            auVar28._24_4_ = fVar213 * fVar103;
            auVar28._28_4_ = auVar96._12_4_;
            auVar18 = vsubps_avx(auVar28,auVar27);
            auVar29._4_4_ = fVar229 * fVar207;
            auVar29._0_4_ = fVar225 * fVar203;
            auVar29._8_4_ = fVar230 * fVar209;
            auVar29._12_4_ = fVar231 * fVar210;
            auVar29._16_4_ = fVar232 * fVar211;
            auVar29._20_4_ = fVar233 * fVar212;
            auVar29._24_4_ = fVar234 * fVar213;
            auVar29._28_4_ = local_28e0._28_4_ + auVar14._28_4_;
            auVar30._4_4_ = fVar219 * fVar161;
            auVar30._0_4_ = fVar216 * fVar153;
            auVar30._8_4_ = fVar220 * fVar163;
            auVar30._12_4_ = fVar221 * fVar165;
            auVar30._16_4_ = fVar222 * fVar167;
            auVar30._20_4_ = fVar223 * fVar169;
            auVar30._24_4_ = fVar224 * fVar171;
            auVar30._28_4_ = auVar15._28_4_ + fVar105;
            auVar108 = vsubps_avx(auVar30,auVar29);
            local_2a40._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_29a0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_2a00._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_2a00._0_4_ = local_2a00._4_4_;
            fStack_29f8 = (float)local_2a00._4_4_;
            fStack_29f4 = (float)local_2a00._4_4_;
            fStack_29f0 = (float)local_2a00._4_4_;
            fStack_29ec = (float)local_2a00._4_4_;
            fStack_29e8 = (float)local_2a00._4_4_;
            fStack_29e4 = (float)local_2a00._4_4_;
            local_2a20._0_4_ =
                 (float)local_2a00._4_4_ * auVar17._0_4_ +
                 local_2a40._4_4_ * auVar18._0_4_ + local_29a0._4_4_ * auVar108._0_4_;
            local_2a20._4_4_ =
                 (float)local_2a00._4_4_ * auVar17._4_4_ +
                 local_2a40._4_4_ * auVar18._4_4_ + local_29a0._4_4_ * auVar108._4_4_;
            fStack_2a18 = (float)local_2a00._4_4_ * auVar17._8_4_ +
                          local_2a40._4_4_ * auVar18._8_4_ + local_29a0._4_4_ * auVar108._8_4_;
            fStack_2a14 = (float)local_2a00._4_4_ * auVar17._12_4_ +
                          local_2a40._4_4_ * auVar18._12_4_ + local_29a0._4_4_ * auVar108._12_4_;
            fStack_2a10 = (float)local_2a00._4_4_ * auVar17._16_4_ +
                          local_2a40._4_4_ * auVar18._16_4_ + local_29a0._4_4_ * auVar108._16_4_;
            fStack_2a0c = (float)local_2a00._4_4_ * auVar17._20_4_ +
                          local_2a40._4_4_ * auVar18._20_4_ + local_29a0._4_4_ * auVar108._20_4_;
            fStack_2a08 = (float)local_2a00._4_4_ * auVar17._24_4_ +
                          local_2a40._4_4_ * auVar18._24_4_ + local_29a0._4_4_ * auVar108._24_4_;
            fStack_2a04 = auVar18._28_4_ + auVar18._28_4_ + auVar108._28_4_;
            auVar17 = vsubps_avx(local_2760,auVar147);
            _local_2820 = vsubps_avx(local_2780,auVar13);
            fVar207 = fVar3 + auVar147._0_4_;
            fVar209 = fVar10 + auVar147._4_4_;
            fVar210 = fVar11 + auVar147._8_4_;
            fVar211 = fVar12 + auVar147._12_4_;
            fVar212 = fVar104 + auVar147._16_4_;
            fVar213 = fVar113 + auVar147._20_4_;
            fVar172 = fVar114 + auVar147._24_4_;
            fVar185 = fVar253 + auVar13._0_4_;
            fVar188 = fVar255 + auVar13._4_4_;
            fVar191 = fVar256 + auVar13._8_4_;
            fVar194 = fVar257 + auVar13._12_4_;
            fVar197 = fVar258 + auVar13._16_4_;
            fVar200 = fVar259 + auVar13._20_4_;
            fVar203 = fVar260 + auVar13._24_4_;
            fVar153 = auVar13._28_4_;
            fVar161 = local_2820._0_4_;
            fVar163 = local_2820._4_4_;
            auVar31._4_4_ = fVar163 * fVar209;
            auVar31._0_4_ = fVar161 * fVar207;
            fVar165 = local_2820._8_4_;
            auVar31._8_4_ = fVar165 * fVar210;
            fVar167 = local_2820._12_4_;
            auVar31._12_4_ = fVar167 * fVar211;
            fVar169 = local_2820._16_4_;
            auVar31._16_4_ = fVar169 * fVar212;
            fVar171 = local_2820._20_4_;
            auVar31._20_4_ = fVar171 * fVar213;
            fVar180 = local_2820._24_4_;
            auVar31._24_4_ = fVar180 * fVar172;
            auVar31._28_4_ = fVar125;
            fVar181 = auVar17._0_4_;
            fVar186 = auVar17._4_4_;
            auVar32._4_4_ = fVar186 * fVar188;
            auVar32._0_4_ = fVar181 * fVar185;
            fVar189 = auVar17._8_4_;
            auVar32._8_4_ = fVar189 * fVar191;
            fVar192 = auVar17._12_4_;
            auVar32._12_4_ = fVar192 * fVar194;
            fVar195 = auVar17._16_4_;
            auVar32._16_4_ = fVar195 * fVar197;
            fVar198 = auVar17._20_4_;
            auVar32._20_4_ = fVar198 * fVar200;
            fVar201 = auVar17._24_4_;
            auVar32._24_4_ = fVar201 * fVar203;
            auVar32._28_4_ = fVar105;
            auVar18 = vsubps_avx(auVar32,auVar31);
            local_2800 = vsubps_avx(local_28e0,auVar120);
            fVar235 = local_2800._0_4_;
            fVar238 = local_2800._4_4_;
            auVar33._4_4_ = fVar238 * fVar188;
            auVar33._0_4_ = fVar235 * fVar185;
            fVar239 = local_2800._8_4_;
            auVar33._8_4_ = fVar239 * fVar191;
            fVar240 = local_2800._12_4_;
            auVar33._12_4_ = fVar240 * fVar194;
            fVar241 = local_2800._16_4_;
            auVar33._16_4_ = fVar241 * fVar197;
            fVar242 = local_2800._20_4_;
            auVar33._20_4_ = fVar242 * fVar200;
            fVar243 = local_2800._24_4_;
            auVar33._24_4_ = fVar243 * fVar203;
            auVar33._28_4_ = fVar125 + fVar153;
            fVar185 = fVar244 + auVar120._0_4_;
            fVar188 = fVar247 + auVar120._4_4_;
            fVar191 = fVar248 + auVar120._8_4_;
            fVar194 = fVar249 + auVar120._12_4_;
            fVar197 = fVar250 + auVar120._16_4_;
            fVar200 = fVar251 + auVar120._20_4_;
            fVar203 = fVar252 + auVar120._24_4_;
            auVar131 = _local_2820;
            auVar34._4_4_ = fVar188 * fVar163;
            auVar34._0_4_ = fVar185 * fVar161;
            auVar34._8_4_ = fVar191 * fVar165;
            auVar34._12_4_ = fVar194 * fVar167;
            auVar34._16_4_ = fVar197 * fVar169;
            auVar34._20_4_ = fVar200 * fVar171;
            auVar34._24_4_ = fVar203 * fVar180;
            auVar34._28_4_ = local_27c0._28_4_;
            auVar108 = vsubps_avx(auVar34,auVar33);
            auVar35._4_4_ = fVar186 * fVar188;
            auVar35._0_4_ = fVar181 * fVar185;
            auVar35._8_4_ = fVar189 * fVar191;
            auVar35._12_4_ = fVar192 * fVar194;
            auVar35._16_4_ = fVar195 * fVar197;
            auVar35._20_4_ = fVar198 * fVar200;
            auVar35._24_4_ = fVar201 * fVar203;
            auVar35._28_4_ = local_28e0._28_4_ + auVar120._28_4_;
            auVar36._4_4_ = fVar238 * fVar209;
            auVar36._0_4_ = fVar235 * fVar207;
            auVar36._8_4_ = fVar239 * fVar210;
            auVar36._12_4_ = fVar240 * fVar211;
            auVar36._16_4_ = fVar241 * fVar212;
            auVar36._20_4_ = fVar242 * fVar213;
            auVar36._24_4_ = fVar243 * fVar172;
            auVar36._28_4_ = fVar105 + auVar147._28_4_;
            auVar121 = vsubps_avx(auVar36,auVar35);
            local_26c0._0_4_ =
                 (float)local_2a00._4_4_ * auVar18._0_4_ +
                 local_2a40._4_4_ * auVar108._0_4_ + local_29a0._4_4_ * auVar121._0_4_;
            local_26c0._4_4_ =
                 (float)local_2a00._4_4_ * auVar18._4_4_ +
                 local_2a40._4_4_ * auVar108._4_4_ + local_29a0._4_4_ * auVar121._4_4_;
            local_26c0._8_4_ =
                 (float)local_2a00._4_4_ * auVar18._8_4_ +
                 local_2a40._4_4_ * auVar108._8_4_ + local_29a0._4_4_ * auVar121._8_4_;
            local_26c0._12_4_ =
                 (float)local_2a00._4_4_ * auVar18._12_4_ +
                 local_2a40._4_4_ * auVar108._12_4_ + local_29a0._4_4_ * auVar121._12_4_;
            local_26c0._16_4_ =
                 (float)local_2a00._4_4_ * auVar18._16_4_ +
                 local_2a40._4_4_ * auVar108._16_4_ + local_29a0._4_4_ * auVar121._16_4_;
            local_26c0._20_4_ =
                 (float)local_2a00._4_4_ * auVar18._20_4_ +
                 local_2a40._4_4_ * auVar108._20_4_ + local_29a0._4_4_ * auVar121._20_4_;
            local_26c0._24_4_ =
                 (float)local_2a00._4_4_ * auVar18._24_4_ +
                 local_2a40._4_4_ * auVar108._24_4_ + local_29a0._4_4_ * auVar121._24_4_;
            local_26c0._28_4_ = auVar18._28_4_ + auVar108._28_4_ + auVar121._28_4_;
            auVar108 = vsubps_avx(auVar120,auVar14);
            fVar105 = auVar120._0_4_ + auVar14._0_4_;
            fVar185 = auVar120._4_4_ + auVar14._4_4_;
            fVar188 = auVar120._8_4_ + auVar14._8_4_;
            fVar191 = auVar120._12_4_ + auVar14._12_4_;
            fVar194 = auVar120._16_4_ + auVar14._16_4_;
            fVar197 = auVar120._20_4_ + auVar14._20_4_;
            fVar200 = auVar120._24_4_ + auVar14._24_4_;
            auVar121 = vsubps_avx(auVar147,auVar15);
            fVar203 = auVar147._0_4_ + auVar15._0_4_;
            fVar207 = auVar147._4_4_ + auVar15._4_4_;
            fVar209 = auVar147._8_4_ + auVar15._8_4_;
            fVar210 = auVar147._12_4_ + auVar15._12_4_;
            fVar211 = auVar147._16_4_ + auVar15._16_4_;
            fVar212 = auVar147._20_4_ + auVar15._20_4_;
            fVar213 = auVar147._24_4_ + auVar15._24_4_;
            fVar172 = auVar147._28_4_ + auVar15._28_4_;
            auVar147 = vsubps_avx(auVar13,auVar16);
            auVar160 = ZEXT3264(auVar147);
            fVar125 = auVar13._0_4_ + auVar16._0_4_;
            fVar138 = auVar13._4_4_ + auVar16._4_4_;
            fVar139 = auVar13._8_4_ + auVar16._8_4_;
            fVar140 = auVar13._12_4_ + auVar16._12_4_;
            fVar141 = auVar13._16_4_ + auVar16._16_4_;
            fVar142 = auVar13._20_4_ + auVar16._20_4_;
            fVar143 = auVar13._24_4_ + auVar16._24_4_;
            fVar154 = auVar147._0_4_;
            fVar162 = auVar147._4_4_;
            auVar37._4_4_ = fVar162 * fVar207;
            auVar37._0_4_ = fVar154 * fVar203;
            fVar164 = auVar147._8_4_;
            auVar37._8_4_ = fVar164 * fVar209;
            fVar166 = auVar147._12_4_;
            auVar37._12_4_ = fVar166 * fVar210;
            fVar168 = auVar147._16_4_;
            auVar37._16_4_ = fVar168 * fVar211;
            fVar170 = auVar147._20_4_;
            auVar37._20_4_ = fVar170 * fVar212;
            fVar173 = auVar147._24_4_;
            auVar37._24_4_ = fVar173 * fVar213;
            auVar37._28_4_ = auVar18._28_4_;
            fVar182 = auVar121._0_4_;
            fVar187 = auVar121._4_4_;
            auVar38._4_4_ = fVar187 * fVar138;
            auVar38._0_4_ = fVar182 * fVar125;
            fVar190 = auVar121._8_4_;
            auVar38._8_4_ = fVar190 * fVar139;
            fVar193 = auVar121._12_4_;
            auVar38._12_4_ = fVar193 * fVar140;
            fVar196 = auVar121._16_4_;
            auVar38._16_4_ = fVar196 * fVar141;
            fVar199 = auVar121._20_4_;
            auVar38._20_4_ = fVar199 * fVar142;
            fVar202 = auVar121._24_4_;
            auVar38._24_4_ = fVar202 * fVar143;
            auVar38._28_4_ = fVar153;
            auVar147 = vsubps_avx(auVar38,auVar37);
            fVar204 = auVar108._0_4_;
            fVar208 = auVar108._4_4_;
            auVar39._4_4_ = fVar208 * fVar138;
            auVar39._0_4_ = fVar204 * fVar125;
            fVar125 = auVar108._8_4_;
            auVar39._8_4_ = fVar125 * fVar139;
            fVar138 = auVar108._12_4_;
            auVar39._12_4_ = fVar138 * fVar140;
            fVar139 = auVar108._16_4_;
            auVar39._16_4_ = fVar139 * fVar141;
            fVar140 = auVar108._20_4_;
            auVar39._20_4_ = fVar140 * fVar142;
            fVar141 = auVar108._24_4_;
            auVar39._24_4_ = fVar141 * fVar143;
            auVar39._28_4_ = fVar153 + auVar16._28_4_;
            auVar40._4_4_ = fVar162 * fVar185;
            auVar40._0_4_ = fVar154 * fVar105;
            auVar40._8_4_ = fVar164 * fVar188;
            auVar40._12_4_ = fVar166 * fVar191;
            auVar40._16_4_ = fVar168 * fVar194;
            auVar40._20_4_ = fVar170 * fVar197;
            auVar40._24_4_ = fVar173 * fVar200;
            auVar40._28_4_ = fVar153;
            auVar13 = vsubps_avx(auVar40,auVar39);
            auVar41._4_4_ = fVar187 * fVar185;
            auVar41._0_4_ = fVar182 * fVar105;
            auVar41._8_4_ = fVar190 * fVar188;
            auVar41._12_4_ = fVar193 * fVar191;
            auVar41._16_4_ = fVar196 * fVar194;
            auVar41._20_4_ = fVar199 * fVar197;
            auVar41._24_4_ = fVar202 * fVar200;
            auVar41._28_4_ = auVar120._28_4_ + auVar14._28_4_;
            auVar42._4_4_ = fVar208 * fVar207;
            auVar42._0_4_ = fVar204 * fVar203;
            auVar42._8_4_ = fVar125 * fVar209;
            auVar42._12_4_ = fVar138 * fVar210;
            auVar42._16_4_ = fVar139 * fVar211;
            auVar42._20_4_ = fVar140 * fVar212;
            auVar42._24_4_ = fVar141 * fVar213;
            auVar42._28_4_ = fVar172;
            auVar120 = vsubps_avx(auVar42,auVar41);
            local_29a0._0_4_ = local_29a0._4_4_;
            fStack_2998 = local_29a0._4_4_;
            fStack_2994 = local_29a0._4_4_;
            fStack_2990 = local_29a0._4_4_;
            fStack_298c = local_29a0._4_4_;
            fStack_2988 = local_29a0._4_4_;
            fStack_2984 = local_29a0._4_4_;
            local_2a40._0_4_ = (uint)local_2a40._4_4_;
            fStack_2a38 = local_2a40._4_4_;
            fStack_2a34 = local_2a40._4_4_;
            fStack_2a30 = local_2a40._4_4_;
            fStack_2a2c = local_2a40._4_4_;
            fStack_2a28 = local_2a40._4_4_;
            fStack_2a24 = local_2a40._4_4_;
            auVar110._0_4_ =
                 (float)local_2a00._4_4_ * auVar147._0_4_ +
                 local_2a40._4_4_ * auVar13._0_4_ + local_29a0._4_4_ * auVar120._0_4_;
            auVar110._4_4_ =
                 (float)local_2a00._4_4_ * auVar147._4_4_ +
                 local_2a40._4_4_ * auVar13._4_4_ + local_29a0._4_4_ * auVar120._4_4_;
            auVar110._8_4_ =
                 (float)local_2a00._4_4_ * auVar147._8_4_ +
                 local_2a40._4_4_ * auVar13._8_4_ + local_29a0._4_4_ * auVar120._8_4_;
            auVar110._12_4_ =
                 (float)local_2a00._4_4_ * auVar147._12_4_ +
                 local_2a40._4_4_ * auVar13._12_4_ + local_29a0._4_4_ * auVar120._12_4_;
            auVar110._16_4_ =
                 (float)local_2a00._4_4_ * auVar147._16_4_ +
                 local_2a40._4_4_ * auVar13._16_4_ + local_29a0._4_4_ * auVar120._16_4_;
            auVar110._20_4_ =
                 (float)local_2a00._4_4_ * auVar147._20_4_ +
                 local_2a40._4_4_ * auVar13._20_4_ + local_29a0._4_4_ * auVar120._20_4_;
            auVar110._24_4_ =
                 (float)local_2a00._4_4_ * auVar147._24_4_ +
                 local_2a40._4_4_ * auVar13._24_4_ + local_29a0._4_4_ * auVar120._24_4_;
            auVar110._28_4_ = fVar172 + fVar172 + auVar120._28_4_;
            local_26a0._0_4_ = auVar110._0_4_ + local_26c0._0_4_ + (float)local_2a20._0_4_;
            local_26a0._4_4_ = auVar110._4_4_ + local_26c0._4_4_ + (float)local_2a20._4_4_;
            local_26a0._8_4_ = auVar110._8_4_ + local_26c0._8_4_ + fStack_2a18;
            local_26a0._12_4_ = auVar110._12_4_ + local_26c0._12_4_ + fStack_2a14;
            local_26a0._16_4_ = auVar110._16_4_ + local_26c0._16_4_ + fStack_2a10;
            local_26a0._20_4_ = auVar110._20_4_ + local_26c0._20_4_ + fStack_2a0c;
            local_26a0._24_4_ = auVar110._24_4_ + local_26c0._24_4_ + fStack_2a08;
            local_26a0._28_4_ = auVar110._28_4_ + local_26c0._28_4_ + fStack_2a04;
            auVar120 = vminps_avx(_local_2a20,local_26c0);
            auVar120 = vminps_avx(auVar120,auVar110);
            auVar133._8_4_ = 0x7fffffff;
            auVar133._0_8_ = 0x7fffffff7fffffff;
            auVar133._12_4_ = 0x7fffffff;
            auVar133._16_4_ = 0x7fffffff;
            auVar133._20_4_ = 0x7fffffff;
            auVar133._24_4_ = 0x7fffffff;
            auVar133._28_4_ = 0x7fffffff;
            _local_2840 = vandps_avx(local_26a0,auVar133);
            fVar105 = local_2840._0_4_ * 1.1920929e-07;
            fVar153 = local_2840._4_4_ * 1.1920929e-07;
            auVar43._4_4_ = fVar153;
            auVar43._0_4_ = fVar105;
            fVar185 = local_2840._8_4_ * 1.1920929e-07;
            auVar43._8_4_ = fVar185;
            fVar188 = local_2840._12_4_ * 1.1920929e-07;
            auVar43._12_4_ = fVar188;
            fVar191 = local_2840._16_4_ * 1.1920929e-07;
            auVar43._16_4_ = fVar191;
            fVar194 = local_2840._20_4_ * 1.1920929e-07;
            auVar43._20_4_ = fVar194;
            fVar197 = local_2840._24_4_ * 1.1920929e-07;
            auVar43._24_4_ = fVar197;
            auVar43._28_4_ = 0x34000000;
            auVar137 = ZEXT3264(auVar43);
            auVar150._0_8_ = CONCAT44(fVar153,fVar105) ^ 0x8000000080000000;
            auVar150._8_4_ = -fVar185;
            auVar150._12_4_ = -fVar188;
            auVar150._16_4_ = -fVar191;
            auVar150._20_4_ = -fVar194;
            auVar150._24_4_ = -fVar197;
            auVar150._28_4_ = 0xb4000000;
            auVar120 = vcmpps_avx(auVar120,auVar150,5);
            auVar13 = vmaxps_avx(_local_2a20,local_26c0);
            auVar152 = ZEXT3264(auVar13);
            auVar147 = vmaxps_avx(auVar13,auVar110);
            auVar147 = vcmpps_avx(auVar147,auVar43,2);
            auVar147 = vorps_avx(auVar120,auVar147);
            _local_2860 = auVar130;
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar147 >> 0x7f,0) != '\0') ||
                  (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0xbf,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar147[0x1f] < '\0') {
              auVar44._4_4_ = fVar186 * fVar116;
              auVar44._0_4_ = fVar181 * fVar115;
              auVar44._8_4_ = fVar189 * fVar117;
              auVar44._12_4_ = fVar192 * fVar100;
              auVar44._16_4_ = fVar195 * fVar101;
              auVar44._20_4_ = fVar198 * fVar102;
              auVar44._24_4_ = fVar201 * fVar103;
              auVar44._28_4_ = auVar120._28_4_;
              auVar45._4_4_ = fVar229 * fVar163;
              auVar45._0_4_ = fVar225 * fVar161;
              auVar45._8_4_ = fVar230 * fVar165;
              auVar45._12_4_ = fVar231 * fVar167;
              auVar45._16_4_ = fVar232 * fVar169;
              auVar45._20_4_ = fVar233 * fVar171;
              auVar45._24_4_ = fVar234 * fVar180;
              auVar45._28_4_ = 0x34000000;
              auVar14 = vsubps_avx(auVar45,auVar44);
              auVar46._4_4_ = fVar187 * fVar163;
              auVar46._0_4_ = fVar182 * fVar161;
              auVar46._8_4_ = fVar190 * fVar165;
              auVar46._12_4_ = fVar193 * fVar167;
              auVar46._16_4_ = fVar196 * fVar169;
              auVar46._20_4_ = fVar199 * fVar171;
              auVar46._24_4_ = fVar202 * fVar180;
              auVar46._28_4_ = auVar13._28_4_;
              auVar47._4_4_ = fVar186 * fVar162;
              auVar47._0_4_ = fVar181 * fVar154;
              auVar47._8_4_ = fVar189 * fVar164;
              auVar47._12_4_ = fVar192 * fVar166;
              auVar47._16_4_ = fVar195 * fVar168;
              auVar47._20_4_ = fVar198 * fVar170;
              auVar47._24_4_ = fVar201 * fVar173;
              auVar47._28_4_ = auVar108._28_4_;
              auVar15 = vsubps_avx(auVar47,auVar46);
              auVar227._8_4_ = 0x7fffffff;
              auVar227._0_8_ = 0x7fffffff7fffffff;
              auVar227._12_4_ = 0x7fffffff;
              auVar227._16_4_ = 0x7fffffff;
              auVar227._20_4_ = 0x7fffffff;
              auVar227._24_4_ = 0x7fffffff;
              auVar227._28_4_ = 0x7fffffff;
              _local_2860 = local_26c0;
              local_2880 = local_26a0;
              auVar120 = vandps_avx(auVar227,auVar44);
              auVar13 = vandps_avx(auVar227,auVar46);
              auVar120 = vcmpps_avx(auVar120,auVar13,1);
              local_2680 = vblendvps_avx(auVar15,auVar14,auVar120);
              auVar48._4_4_ = fVar238 * fVar162;
              auVar48._0_4_ = fVar235 * fVar154;
              auVar48._8_4_ = fVar239 * fVar164;
              auVar48._12_4_ = fVar240 * fVar166;
              auVar48._16_4_ = fVar241 * fVar168;
              auVar48._20_4_ = fVar242 * fVar170;
              auVar48._24_4_ = fVar243 * fVar173;
              auVar48._28_4_ = auVar120._28_4_;
              auVar49._4_4_ = fVar238 * fVar116;
              auVar49._0_4_ = fVar235 * fVar115;
              auVar49._8_4_ = fVar239 * fVar117;
              auVar49._12_4_ = fVar240 * fVar100;
              auVar49._16_4_ = fVar241 * fVar101;
              auVar49._20_4_ = fVar242 * fVar102;
              auVar49._24_4_ = fVar243 * fVar103;
              auVar49._28_4_ = auVar14._28_4_;
              auVar50._4_4_ = fVar219 * fVar163;
              auVar50._0_4_ = fVar216 * fVar161;
              auVar50._8_4_ = fVar220 * fVar165;
              auVar50._12_4_ = fVar221 * fVar167;
              auVar50._16_4_ = fVar222 * fVar169;
              auVar50._20_4_ = fVar223 * fVar171;
              auVar50._24_4_ = fVar224 * fVar180;
              auVar50._28_4_ = auVar13._28_4_;
              auVar14 = vsubps_avx(auVar49,auVar50);
              auVar51._4_4_ = fVar163 * fVar208;
              auVar51._0_4_ = fVar161 * fVar204;
              auVar51._8_4_ = fVar165 * fVar125;
              auVar51._12_4_ = fVar167 * fVar138;
              auVar51._16_4_ = fVar169 * fVar139;
              auVar51._20_4_ = fVar171 * fVar140;
              auVar51._24_4_ = fVar180 * fVar141;
              auVar51._28_4_ = uStack_2804;
              auVar15 = vsubps_avx(auVar51,auVar48);
              auVar120 = vandps_avx(auVar227,auVar50);
              auVar13 = vandps_avx(auVar227,auVar48);
              auVar13 = vcmpps_avx(auVar120,auVar13,1);
              local_2660 = vblendvps_avx(auVar15,auVar14,auVar13);
              auVar52._4_4_ = fVar186 * fVar208;
              auVar52._0_4_ = fVar181 * fVar204;
              auVar52._8_4_ = fVar189 * fVar125;
              auVar52._12_4_ = fVar192 * fVar138;
              auVar52._16_4_ = fVar195 * fVar139;
              auVar52._20_4_ = fVar198 * fVar140;
              auVar52._24_4_ = fVar201 * fVar141;
              auVar52._28_4_ = auVar13._28_4_;
              auVar53._4_4_ = fVar219 * fVar186;
              auVar53._0_4_ = fVar216 * fVar181;
              auVar53._8_4_ = fVar220 * fVar189;
              auVar53._12_4_ = fVar221 * fVar192;
              auVar53._16_4_ = fVar222 * fVar195;
              auVar53._20_4_ = fVar223 * fVar198;
              auVar53._24_4_ = fVar224 * fVar201;
              auVar53._28_4_ = auVar14._28_4_;
              auVar54._4_4_ = fVar229 * fVar238;
              auVar54._0_4_ = fVar225 * fVar235;
              auVar54._8_4_ = fVar230 * fVar239;
              auVar54._12_4_ = fVar231 * fVar240;
              auVar54._16_4_ = fVar232 * fVar241;
              auVar54._20_4_ = fVar233 * fVar242;
              auVar54._24_4_ = fVar234 * fVar243;
              auVar54._28_4_ = auVar120._28_4_;
              auVar55._4_4_ = fVar238 * fVar187;
              auVar55._0_4_ = fVar235 * fVar182;
              auVar55._8_4_ = fVar239 * fVar190;
              auVar55._12_4_ = fVar240 * fVar193;
              auVar55._16_4_ = fVar241 * fVar196;
              auVar55._20_4_ = fVar242 * fVar199;
              auVar55._24_4_ = fVar243 * fVar202;
              auVar55._28_4_ = uStack_27c4;
              auVar14 = vsubps_avx(auVar53,auVar54);
              auVar15 = vsubps_avx(auVar55,auVar52);
              auVar120 = vandps_avx(auVar54,auVar227);
              auVar13 = vandps_avx(auVar52,auVar227);
              auVar120 = vcmpps_avx(auVar120,auVar13,1);
              local_2640 = vblendvps_avx(auVar15,auVar14,auVar120);
              auVar160 = ZEXT3264(local_2640);
              auVar127 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
              fVar100 = local_2640._0_4_;
              fVar167 = local_2640._4_4_;
              fVar101 = local_2640._8_4_;
              fVar169 = local_2640._12_4_;
              fVar102 = local_2640._16_4_;
              fVar171 = local_2640._20_4_;
              fVar103 = local_2640._24_4_;
              fVar180 = local_2660._0_4_;
              fVar185 = local_2660._4_4_;
              fVar188 = local_2660._8_4_;
              fVar191 = local_2660._12_4_;
              fVar194 = local_2660._16_4_;
              fVar197 = local_2660._20_4_;
              fVar200 = local_2660._24_4_;
              fVar203 = local_2680._0_4_;
              fVar207 = local_2680._4_4_;
              fVar209 = local_2680._8_4_;
              fVar210 = local_2680._12_4_;
              fVar211 = local_2680._16_4_;
              fVar212 = local_2680._20_4_;
              fVar213 = local_2680._24_4_;
              fVar105 = fVar203 * (float)local_2a00._4_4_ +
                        fVar180 * local_2a40._4_4_ + fVar100 * local_29a0._4_4_;
              fVar153 = fVar207 * (float)local_2a00._4_4_ +
                        fVar185 * local_2a40._4_4_ + fVar167 * local_29a0._4_4_;
              fVar115 = fVar209 * (float)local_2a00._4_4_ +
                        fVar188 * local_2a40._4_4_ + fVar101 * local_29a0._4_4_;
              fVar161 = fVar210 * (float)local_2a00._4_4_ +
                        fVar191 * local_2a40._4_4_ + fVar169 * local_29a0._4_4_;
              fVar116 = fVar211 * (float)local_2a00._4_4_ +
                        fVar194 * local_2a40._4_4_ + fVar102 * local_29a0._4_4_;
              fVar163 = fVar212 * (float)local_2a00._4_4_ +
                        fVar197 * local_2a40._4_4_ + fVar171 * local_29a0._4_4_;
              fVar117 = fVar213 * (float)local_2a00._4_4_ +
                        fVar200 * local_2a40._4_4_ + fVar103 * local_29a0._4_4_;
              fVar165 = auVar120._28_4_ + auVar120._28_4_ + auVar108._28_4_;
              auVar111._0_4_ = fVar105 + fVar105;
              auVar111._4_4_ = fVar153 + fVar153;
              auVar111._8_4_ = fVar115 + fVar115;
              auVar111._12_4_ = fVar161 + fVar161;
              auVar111._16_4_ = fVar116 + fVar116;
              auVar111._20_4_ = fVar163 + fVar163;
              auVar111._24_4_ = fVar117 + fVar117;
              auVar111._28_4_ = fVar165 + fVar165;
              auVar120 = vrcpps_avx(auVar111);
              fVar105 = fVar203 * fVar244 + fVar180 * fVar3 + fVar100 * fVar253;
              fVar153 = fVar207 * fVar247 + fVar185 * fVar10 + fVar167 * fVar255;
              fVar115 = fVar209 * fVar248 + fVar188 * fVar11 + fVar101 * fVar256;
              fVar161 = fVar210 * fVar249 + fVar191 * fVar12 + fVar169 * fVar257;
              fVar116 = fVar211 * fVar250 + fVar194 * fVar104 + fVar102 * fVar258;
              fVar163 = fVar212 * fVar251 + fVar197 * fVar113 + fVar171 * fVar259;
              fVar117 = fVar213 * fVar252 + fVar200 * fVar114 + fVar103 * fVar260;
              fVar3 = auVar120._0_4_;
              fVar10 = auVar120._4_4_;
              auVar56._4_4_ = auVar111._4_4_ * fVar10;
              auVar56._0_4_ = auVar111._0_4_ * fVar3;
              fVar11 = auVar120._8_4_;
              auVar56._8_4_ = auVar111._8_4_ * fVar11;
              fVar12 = auVar120._12_4_;
              auVar56._12_4_ = auVar111._12_4_ * fVar12;
              fVar104 = auVar120._16_4_;
              auVar56._16_4_ = auVar111._16_4_ * fVar104;
              fVar113 = auVar120._20_4_;
              auVar56._20_4_ = auVar111._20_4_ * fVar113;
              fVar114 = auVar120._24_4_;
              auVar56._24_4_ = auVar111._24_4_ * fVar114;
              auVar56._28_4_ = auVar14._28_4_;
              auVar175._8_4_ = 0x3f800000;
              auVar175._0_8_ = 0x3f8000003f800000;
              auVar175._12_4_ = 0x3f800000;
              auVar175._16_4_ = 0x3f800000;
              auVar175._20_4_ = 0x3f800000;
              auVar175._24_4_ = 0x3f800000;
              auVar175._28_4_ = 0x3f800000;
              auVar120 = vsubps_avx(auVar175,auVar56);
              uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar151._4_4_ = uVar4;
              auVar151._0_4_ = uVar4;
              auVar151._8_4_ = uVar4;
              auVar151._12_4_ = uVar4;
              auVar151._16_4_ = uVar4;
              auVar151._20_4_ = uVar4;
              auVar151._24_4_ = uVar4;
              auVar151._28_4_ = uVar4;
              auVar152 = ZEXT3264(auVar151);
              local_2a00._4_4_ = (fVar153 + fVar153) * (fVar10 + fVar10 * auVar120._4_4_);
              local_2a00._0_4_ = (fVar105 + fVar105) * (fVar3 + fVar3 * auVar120._0_4_);
              fStack_29f8 = (fVar115 + fVar115) * (fVar11 + fVar11 * auVar120._8_4_);
              fStack_29f4 = (fVar161 + fVar161) * (fVar12 + fVar12 * auVar120._12_4_);
              fStack_29f0 = (fVar116 + fVar116) * (fVar104 + fVar104 * auVar120._16_4_);
              fStack_29ec = (fVar163 + fVar163) * (fVar113 + fVar113 * auVar120._20_4_);
              fStack_29e8 = (fVar117 + fVar117) * (fVar114 + fVar114 * auVar120._24_4_);
              fStack_29e4 = (float)auVar17._28_4_;
              auVar120 = vcmpps_avx(auVar151,_local_2a00,2);
              fVar3 = (ray->super_RayK<1>).tfar;
              auVar134._4_4_ = fVar3;
              auVar134._0_4_ = fVar3;
              auVar134._8_4_ = fVar3;
              auVar134._12_4_ = fVar3;
              auVar134._16_4_ = fVar3;
              auVar134._20_4_ = fVar3;
              auVar134._24_4_ = fVar3;
              auVar134._28_4_ = fVar3;
              auVar147 = vcmpps_avx(_local_2a00,auVar134,2);
              auVar137 = ZEXT3264(auVar147);
              auVar120 = vandps_avx(auVar147,auVar120);
              auVar13 = vcmpps_avx(auVar111,_DAT_01faff00,4);
              auVar120 = vandps_avx(auVar120,auVar13);
              auVar129 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
              auVar127 = vpand_avx(auVar129,auVar127);
              auVar129 = vpmovsxwd_avx(auVar127);
              auVar106 = vpshufd_avx(auVar127,0xee);
              auVar106 = vpmovsxwd_avx(auVar106);
              local_2620._16_16_ = auVar106;
              local_2620._0_16_ = auVar129;
              if ((((((((local_2620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_2620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_2620 >> 0x7f,0) != '\0') ||
                    (local_2620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar106 >> 0x3f,0) != '\0') ||
                  (local_2620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar106[0xf] < '\0') {
                local_26e0 = _local_2a20;
                auVar120 = vrcpps_avx(local_26a0);
                fVar3 = auVar120._0_4_;
                fVar10 = auVar120._4_4_;
                auVar57._4_4_ = local_26a0._4_4_ * fVar10;
                auVar57._0_4_ = local_26a0._0_4_ * fVar3;
                fVar11 = auVar120._8_4_;
                auVar57._8_4_ = local_26a0._8_4_ * fVar11;
                fVar12 = auVar120._12_4_;
                auVar57._12_4_ = local_26a0._12_4_ * fVar12;
                fVar104 = auVar120._16_4_;
                auVar57._16_4_ = local_26a0._16_4_ * fVar104;
                fVar113 = auVar120._20_4_;
                auVar57._20_4_ = local_26a0._20_4_ * fVar113;
                fVar114 = auVar120._24_4_;
                auVar57._24_4_ = local_26a0._24_4_ * fVar114;
                auVar57._28_4_ = auVar147._28_4_;
                auVar178._8_4_ = 0x3f800000;
                auVar178._0_8_ = 0x3f8000003f800000;
                auVar178._12_4_ = 0x3f800000;
                auVar178._16_4_ = 0x3f800000;
                auVar178._20_4_ = 0x3f800000;
                auVar178._24_4_ = 0x3f800000;
                auVar178._28_4_ = 0x3f800000;
                auVar147 = vsubps_avx(auVar178,auVar57);
                auVar123._0_4_ = fVar3 + fVar3 * auVar147._0_4_;
                auVar123._4_4_ = fVar10 + fVar10 * auVar147._4_4_;
                auVar123._8_4_ = fVar11 + fVar11 * auVar147._8_4_;
                auVar123._12_4_ = fVar12 + fVar12 * auVar147._12_4_;
                auVar123._16_4_ = fVar104 + fVar104 * auVar147._16_4_;
                auVar123._20_4_ = fVar113 + fVar113 * auVar147._20_4_;
                auVar123._24_4_ = fVar114 + fVar114 * auVar147._24_4_;
                auVar123._28_4_ = auVar120._28_4_ + auVar147._28_4_;
                auVar135._8_4_ = 0x219392ef;
                auVar135._0_8_ = 0x219392ef219392ef;
                auVar135._12_4_ = 0x219392ef;
                auVar135._16_4_ = 0x219392ef;
                auVar135._20_4_ = 0x219392ef;
                auVar135._24_4_ = 0x219392ef;
                auVar135._28_4_ = 0x219392ef;
                auVar147 = vcmpps_avx(_local_2840,auVar135,5);
                auVar120 = vandps_avx(auVar147,auVar123);
                local_25c0 = _local_2a00;
                local_2540 = local_23e0;
                auVar58._4_4_ = (float)local_2a20._4_4_ * auVar120._4_4_;
                auVar58._0_4_ = (float)local_2a20._0_4_ * auVar120._0_4_;
                auVar58._8_4_ = fStack_2a18 * auVar120._8_4_;
                auVar58._12_4_ = fStack_2a14 * auVar120._12_4_;
                auVar58._16_4_ = fStack_2a10 * auVar120._16_4_;
                auVar58._20_4_ = fStack_2a0c * auVar120._20_4_;
                auVar58._24_4_ = fStack_2a08 * auVar120._24_4_;
                auVar58._28_4_ = auVar147._28_4_;
                auVar147 = vminps_avx(auVar58,auVar178);
                auVar59._4_4_ = local_26c0._4_4_ * auVar120._4_4_;
                auVar59._0_4_ = local_26c0._0_4_ * auVar120._0_4_;
                auVar59._8_4_ = local_26c0._8_4_ * auVar120._8_4_;
                auVar59._12_4_ = local_26c0._12_4_ * auVar120._12_4_;
                auVar59._16_4_ = local_26c0._16_4_ * auVar120._16_4_;
                auVar59._20_4_ = local_26c0._20_4_ * auVar120._20_4_;
                auVar59._24_4_ = local_26c0._24_4_ * auVar120._24_4_;
                auVar59._28_4_ = auVar120._28_4_;
                auVar120 = vminps_avx(auVar59,auVar178);
                auVar13 = vsubps_avx(auVar178,auVar147);
                local_25e0 = vblendvps_avx(auVar120,auVar13,local_23e0);
                auVar120 = vsubps_avx(auVar178,auVar120);
                local_2600 = vblendvps_avx(auVar147,auVar120,local_23e0);
                local_25a0[0] = fVar203 * (float)local_2400._0_4_;
                local_25a0[1] = fVar207 * (float)local_2400._4_4_;
                local_25a0[2] = fVar209 * fStack_23f8;
                local_25a0[3] = fVar210 * fStack_23f4;
                fStack_2590 = fVar211 * fStack_23f0;
                fStack_258c = fVar212 * fStack_23ec;
                fStack_2588 = fVar213 * fStack_23e8;
                uStack_2584 = local_2600._28_4_;
                local_2580[0] = fVar180 * (float)local_2400._0_4_;
                local_2580[1] = fVar185 * (float)local_2400._4_4_;
                local_2580[2] = fVar188 * fStack_23f8;
                local_2580[3] = fVar191 * fStack_23f4;
                fStack_2570 = fVar194 * fStack_23f0;
                fStack_256c = fVar197 * fStack_23ec;
                fStack_2568 = fVar200 * fStack_23e8;
                uStack_2564 = auVar147._28_4_;
                local_2560[0] = (float)local_2400._0_4_ * fVar100;
                local_2560[1] = (float)local_2400._4_4_ * fVar167;
                local_2560[2] = fStack_23f8 * fVar101;
                local_2560[3] = fStack_23f4 * fVar169;
                fStack_2550 = fStack_23f0 * fVar102;
                fStack_254c = fStack_23ec * fVar171;
                fStack_2548 = fStack_23e8 * fVar103;
                uStack_2544 = uStack_23e4;
                auVar129 = vpmovzxwd_avx(auVar127);
                auVar124._0_16_ = vpslld_avx(auVar129,0x1f);
                auVar129 = vpunpckhwd_avx(auVar127,auVar127);
                auVar129 = vpslld_avx(auVar129,0x1f);
                auVar124._16_16_ = auVar129;
                auVar136._8_4_ = 0x7f800000;
                auVar136._0_8_ = 0x7f8000007f800000;
                auVar136._12_4_ = 0x7f800000;
                auVar136._16_4_ = 0x7f800000;
                auVar136._20_4_ = 0x7f800000;
                auVar136._24_4_ = 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar120 = vblendvps_avx(auVar136,_local_2a00,auVar124);
                auVar147 = vshufps_avx(auVar120,auVar120,0xb1);
                auVar147 = vminps_avx(auVar120,auVar147);
                auVar13 = vshufpd_avx(auVar147,auVar147,5);
                auVar147 = vminps_avx(auVar147,auVar13);
                auVar13 = vperm2f128_avx(auVar147,auVar147,1);
                auVar152 = ZEXT3264(auVar13);
                auVar147 = vminps_avx(auVar147,auVar13);
                auVar120 = vcmpps_avx(auVar120,auVar147,0);
                auVar137 = ZEXT1664(auVar120._16_16_);
                auVar129 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
                auVar127 = vpand_avx(auVar129,auVar127);
                auVar129 = vpmovzxwd_avx(auVar127);
                auVar129 = vpslld_avx(auVar129,0x1f);
                auVar129 = vpsrad_avx(auVar129,0x1f);
                auVar127 = vpunpckhwd_avx(auVar127,auVar127);
                auVar127 = vpslld_avx(auVar127,0x1f);
                auVar127 = vpsrad_avx(auVar127,0x1f);
                auVar97._16_16_ = auVar127;
                auVar97._0_16_ = auVar129;
                _local_2a20 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                local_28c0 = local_2620;
                if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar97 >> 0x7f,0) == '\0') &&
                      (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar127 >> 0x3f,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar127[0xf]) {
                  auVar97 = local_2620;
                }
                uVar85 = vextractps_avx(local_2a20._0_16_,1);
                uVar67 = vmovmskps_avx(auVar97);
                uVar68 = 0;
                _local_2970 = auVar61;
                _local_2960 = auVar62;
                _local_2820 = auVar131;
                _local_27e0 = auVar148;
                _local_2740 = auVar63;
                _local_2730 = auVar64;
                _local_2720 = auVar65;
                _local_2710 = auVar66;
                if (uVar67 != 0) {
                  for (; (uVar67 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
                  }
                }
                do {
                  uVar79 = CONCAT44(0,uVar68);
                  uVar68 = *(uint *)((long)&local_23c0 + uVar79 * 4);
                  pGVar7 = (local_2a48->geometries).items[uVar68].ptr;
                  if ((pGVar7->mask & uVar85) == 0) {
                    *(undefined4 *)(local_28c0 + uVar79 * 4) = 0;
                  }
                  else {
                    pRVar87 = local_2a50->args;
                    if (pRVar87->filter == (RTCFilterFunctionN)0x0) {
                      pRVar75 = local_2a50->user;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar3 = *(float *)(local_2600 + uVar79 * 4);
                        fVar10 = *(float *)(local_25e0 + uVar79 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_25c0 + uVar79 * 4);
                        (ray->Ng).field_0.field_0.x = local_25a0[uVar79];
                        (ray->Ng).field_0.field_0.y = local_2580[uVar79];
                        (ray->Ng).field_0.field_0.z = local_2560[uVar79];
                        ray->u = fVar3;
                        ray->v = fVar10;
                        ray->primID = *(uint *)((long)&local_2700 + uVar79 * 4);
                        ray->geomID = uVar68;
                        ray->instID[0] = pRVar75->instID[0];
                        ray->instPrimID[0] = pRVar75->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar75 = local_2a50->user;
                    }
                    local_290c = local_2580[uVar79];
                    auVar137 = ZEXT464((uint)local_290c);
                    local_2908 = local_2560[uVar79];
                    auVar152 = ZEXT464((uint)local_2908);
                    local_2910 = local_25a0[uVar79];
                    local_2904 = *(undefined4 *)(local_2600 + uVar79 * 4);
                    local_2900 = *(undefined4 *)(local_25e0 + uVar79 * 4);
                    local_28fc = *(undefined4 *)((long)&local_2700 + uVar79 * 4);
                    local_28f8 = uVar68;
                    local_28f4 = pRVar75->instID[0];
                    local_28f0 = pRVar75->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_25c0 + uVar79 * 4);
                    local_2a54 = -1;
                    local_29d0.valid = &local_2a54;
                    local_29d0.geometryUserPtr = pGVar7->userPtr;
                    local_29d0.context = pRVar75;
                    local_29d0.ray = (RTCRayN *)ray;
                    local_29d0.hit = (RTCHitN *)&local_2910;
                    local_29d0.N = 1;
                    local_28e0._0_8_ = pGVar7;
                    local_2a40 = uVar79;
                    if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014dc404:
                      if ((pRVar87->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar87->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_28e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar137 = ZEXT1664(auVar137._0_16_);
                        auVar152 = ZEXT1664(auVar152._0_16_);
                        auVar160 = ZEXT1664(auVar160._0_16_);
                        (*pRVar87->filter)(&local_29d0);
                        uVar79 = local_2a40;
                        if (*local_29d0.valid == 0) goto LAB_014dc4a4;
                      }
                      (((Vec3f *)((long)local_29d0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_29d0.hit;
                      (((Vec3f *)((long)local_29d0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_29d0.hit + 4);
                      (((Vec3f *)((long)local_29d0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_29d0.hit + 8);
                      *(float *)((long)local_29d0.ray + 0x3c) = *(float *)(local_29d0.hit + 0xc);
                      *(float *)((long)local_29d0.ray + 0x40) = *(float *)(local_29d0.hit + 0x10);
                      *(float *)((long)local_29d0.ray + 0x44) = *(float *)(local_29d0.hit + 0x14);
                      *(float *)((long)local_29d0.ray + 0x48) = *(float *)(local_29d0.hit + 0x18);
                      *(float *)((long)local_29d0.ray + 0x4c) = *(float *)(local_29d0.hit + 0x1c);
                      *(float *)((long)local_29d0.ray + 0x50) = *(float *)(local_29d0.hit + 0x20);
                    }
                    else {
                      local_29a0 = pRVar87;
                      auVar137 = ZEXT464((uint)local_290c);
                      auVar152 = ZEXT464((uint)local_2908);
                      auVar160 = ZEXT1664(auVar160._0_16_);
                      (*pGVar7->intersectionFilterN)(&local_29d0);
                      uVar79 = local_2a40;
                      pRVar87 = local_29a0;
                      if (*local_29d0.valid != 0) goto LAB_014dc404;
LAB_014dc4a4:
                      (ray->super_RayK<1>).tfar = (float)local_2a20._0_4_;
                    }
                    fVar3 = (ray->super_RayK<1>).tfar;
                    auVar98._4_4_ = fVar3;
                    auVar98._0_4_ = fVar3;
                    auVar98._8_4_ = fVar3;
                    auVar98._12_4_ = fVar3;
                    auVar98._16_4_ = fVar3;
                    auVar98._20_4_ = fVar3;
                    auVar98._24_4_ = fVar3;
                    auVar98._28_4_ = fVar3;
                    *(undefined4 *)(local_28c0 + uVar79 * 4) = 0;
                    auVar120 = vcmpps_avx(_local_2a00,auVar98,2);
                    local_28c0 = vandps_avx(auVar120,local_28c0);
                    uVar85 = (ray->super_RayK<1>).mask;
                    _local_2a20 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  }
                  if ((((((((local_28c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_28c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_28c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_28c0 >> 0x7f,0) == '\0') &&
                        (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_28c0 >> 0xbf,0) == '\0') &&
                      (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_28c0[0x1f]) break;
                  local_2a40._0_4_ = uVar85;
                  BVHNIntersector1<8,16777232,true,embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,true>>>
                  ::intersect(&local_29d0);
                  uVar68 = (uint)local_29d0.valid;
                  uVar85 = (uint)local_2a40;
                } while( true );
              }
            }
            local_2918 = local_2918 + 1;
          } while (local_2918 != local_2940);
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar99 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412
                                                  (fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))))
        ;
        auVar112 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar184 = ZEXT3264(local_2420);
        auVar206 = ZEXT3264(local_2440);
        auVar215 = ZEXT3264(local_2460);
        auVar218 = ZEXT3264(local_2480);
        auVar228 = ZEXT3264(local_24a0);
        auVar237 = ZEXT3264(local_24c0);
        auVar246 = ZEXT3264(local_24e0);
        auVar254 = ZEXT3264(local_2500);
        auVar179 = ZEXT3264(local_2520);
        uVar79 = local_2948;
        uVar93 = local_2950;
      }
    } while (pauVar69 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }